

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalSetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  Index index;
  bool bVar1;
  Location local_b0;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index translated_local_index;
  Index local_index_local;
  BinaryReaderInterp *this_local;
  
  local_1c = param_1;
  _translated_local_index = this;
  local_20 = TranslateLocalIndex(this,param_1);
  GetLocation(&local_48,this);
  index = local_1c;
  GetLocation(&local_b0,this);
  Var::Var(&local_90,index,&local_b0);
  local_24 = (Enum)SharedValidator::OnLocalSet(&this->validator_,&local_48,&local_90);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,LocalSet,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnLocalSetExpr(Index local_index) {
  // See comment in OnLocalGetExpr above.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(
      validator_.OnLocalSet(GetLocation(), Var(local_index, GetLocation())));

  istream_.Emit(Opcode::LocalSet, translated_local_index);
  return Result::Ok;
}